

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

Integer gai_correct_strided_patch(Integer ndim,Integer *lo,Integer *skip,Integer *plo,Integer *phi)

{
  Integer delta;
  Integer i;
  Integer *phi_local;
  Integer *plo_local;
  Integer *skip_local;
  Integer *lo_local;
  Integer ndim_local;
  
  i = 0;
  while( true ) {
    if (ndim <= i) {
      return 1;
    }
    if ((plo[i] - lo[i]) % skip[i] != 0) {
      plo[i] = (plo[i] - (plo[i] - lo[i]) % skip[i]) + skip[i];
    }
    if ((phi[i] - lo[i]) % skip[i] != 0) {
      phi[i] = phi[i] - (phi[i] - lo[i]) % skip[i];
    }
    if (phi[i] < plo[i]) break;
    i = i + 1;
  }
  return 0;
}

Assistant:

Integer gai_correct_strided_patch(Integer ndim,
                                  Integer *lo,
                                  Integer *skip,
                                  Integer *plo,
                                  Integer *phi)
{
  Integer i, delta;
  for (i=0; i<ndim; i++) {
    delta = plo[i]-lo[i];
    if (delta%skip[i] != 0) {
      plo[i] = plo[i] - delta%skip[i] + skip[i];
    }
    delta = phi[i]-lo[i];
    if (delta%skip[i] != 0) {
      phi[i] = phi[i] - delta%skip[i];
    }
    if (phi[i]<plo[i]) return 0;
  }
  return 1;
}